

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O0

void radio_draw_update(t_gobj *client,_glist *glist)

{
  int iVar1;
  char local_a8 [8];
  char tag [128];
  _glist *canvas;
  t_radio *x;
  _glist *glist_local;
  t_gobj *client_local;
  
  iVar1 = glist_isvisible(glist);
  if (iVar1 != 0) {
    tag._120_8_ = glist_getcanvas(glist);
    sprintf(local_a8,"%lxBUT%d",client);
    pdgui_vmess((char *)0x0,"crs rk rk",tag._120_8_,"itemconfigure",local_a8,"-fill",
                *(undefined4 *)&client[0x45].g_pd,"-outline",*(undefined4 *)&client[0x45].g_pd);
    sprintf(local_a8,"%lxBUT%d",client);
    pdgui_vmess((char *)0x0,"crs rk rk",tag._120_8_,"itemconfigure",local_a8,"-fill",
                *(undefined4 *)((long)&client[0x44].g_next + 4),"-outline",
                *(undefined4 *)((long)&client[0x44].g_next + 4));
    *(undefined4 *)&client[0x4a].g_pd = *(undefined4 *)&client[0x49].g_pd;
  }
  return;
}

Assistant:

static void radio_draw_update(t_gobj *client, t_glist *glist)
{
    t_radio *x = (t_radio *)client;
    if(glist_isvisible(glist))
    {
        t_canvas *canvas = glist_getcanvas(glist);
        char tag[128];

        sprintf(tag, "%lxBUT%d", x, x->x_drawn);
        pdgui_vmess(0, "crs rk rk", canvas, "itemconfigure", tag,
            "-fill", x->x_gui.x_bcol,
            "-outline", x->x_gui.x_bcol);

        sprintf(tag, "%lxBUT%d", x, x->x_on);
        pdgui_vmess(0, "crs rk rk", canvas, "itemconfigure", tag,
            "-fill", x->x_gui.x_fcol,
            "-outline", x->x_gui.x_fcol);

        x->x_drawn = x->x_on;
    }
}